

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam000000000019afe0 = 0x2e2e2e2e2e2e2e;
    uRam000000000019afe7._0_1_ = '.';
    uRam000000000019afe7._1_1_ = '.';
    uRam000000000019afe7._2_1_ = '.';
    uRam000000000019afe7._3_1_ = '.';
    uRam000000000019afe7._4_1_ = '.';
    uRam000000000019afe7._5_1_ = '.';
    uRam000000000019afe7._6_1_ = '.';
    uRam000000000019afe7._7_1_ = '.';
    DAT_0019afd0 = '.';
    DAT_0019afd0_1._0_1_ = '.';
    DAT_0019afd0_1._1_1_ = '.';
    DAT_0019afd0_1._2_1_ = '.';
    DAT_0019afd0_1._3_1_ = '.';
    DAT_0019afd0_1._4_1_ = '.';
    DAT_0019afd0_1._5_1_ = '.';
    DAT_0019afd0_1._6_1_ = '.';
    uRam000000000019afd8 = 0x2e2e2e2e2e2e2e;
    DAT_0019afdf = 0x2e;
    DAT_0019afc0 = '.';
    DAT_0019afc0_1._0_1_ = '.';
    DAT_0019afc0_1._1_1_ = '.';
    DAT_0019afc0_1._2_1_ = '.';
    DAT_0019afc0_1._3_1_ = '.';
    DAT_0019afc0_1._4_1_ = '.';
    DAT_0019afc0_1._5_1_ = '.';
    DAT_0019afc0_1._6_1_ = '.';
    uRam000000000019afc8._0_1_ = '.';
    uRam000000000019afc8._1_1_ = '.';
    uRam000000000019afc8._2_1_ = '.';
    uRam000000000019afc8._3_1_ = '.';
    uRam000000000019afc8._4_1_ = '.';
    uRam000000000019afc8._5_1_ = '.';
    uRam000000000019afc8._6_1_ = '.';
    uRam000000000019afc8._7_1_ = '.';
    DAT_0019afb0 = '.';
    DAT_0019afb0_1._0_1_ = '.';
    DAT_0019afb0_1._1_1_ = '.';
    DAT_0019afb0_1._2_1_ = '.';
    DAT_0019afb0_1._3_1_ = '.';
    DAT_0019afb0_1._4_1_ = '.';
    DAT_0019afb0_1._5_1_ = '.';
    DAT_0019afb0_1._6_1_ = '.';
    uRam000000000019afb8._0_1_ = '.';
    uRam000000000019afb8._1_1_ = '.';
    uRam000000000019afb8._2_1_ = '.';
    uRam000000000019afb8._3_1_ = '.';
    uRam000000000019afb8._4_1_ = '.';
    uRam000000000019afb8._5_1_ = '.';
    uRam000000000019afb8._6_1_ = '.';
    uRam000000000019afb8._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam000000000019afa8._0_1_ = '.';
    uRam000000000019afa8._1_1_ = '.';
    uRam000000000019afa8._2_1_ = '.';
    uRam000000000019afa8._3_1_ = '.';
    uRam000000000019afa8._4_1_ = '.';
    uRam000000000019afa8._5_1_ = '.';
    uRam000000000019afa8._6_1_ = '.';
    uRam000000000019afa8._7_1_ = '.';
    DAT_0019afef = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}